

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O1

int PutCoeffs(VP8BitWriter *bw,int ctx,VP8Residual *res)

{
  long lVar1;
  byte bVar2;
  ushort uVar3;
  ProbaArray *paauVar4;
  int iVar5;
  int iVar6;
  ushort uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint8_t (*pauVar11) [11];
  uint8_t *puVar12;
  bool bVar13;
  
  iVar6 = res->first;
  lVar9 = (long)iVar6;
  paauVar4 = res->prob;
  iVar5 = VP8PutBit(bw,(uint)~res->last >> 0x1f,(uint)paauVar4[lVar9][ctx][0]);
  if (iVar5 == 0) {
    iVar5 = 0;
  }
  else {
    iVar5 = 1;
    if (iVar6 < 0x10) {
      pauVar11 = paauVar4[lVar9] + ctx;
      do {
        lVar1 = lVar9 + 1;
        uVar3 = res->coeffs[lVar9];
        uVar7 = -uVar3;
        if (0 < (short)uVar3) {
          uVar7 = uVar3;
        }
        iVar6 = VP8PutBit(bw,(uint)(uVar3 != 0),(uint)(*pauVar11)[1]);
        if (iVar6 == 0) {
          pauVar11 = (uint8_t (*) [11])
                     ((long)*res->prob + (ulong)""[lVar9 + 1] * 0x20 + (ulong)""[lVar9 + 1]);
          bVar13 = false;
        }
        else {
          iVar6 = VP8PutBit(bw,(uint)(1 < uVar7),(uint)(*pauVar11)[2]);
          if (iVar6 == 0) {
            lVar8 = 1;
          }
          else {
            iVar6 = VP8PutBit(bw,(uint)(4 < uVar7),(uint)(*pauVar11)[3]);
            uVar10 = (uint)uVar7;
            if (iVar6 == 0) {
              iVar6 = VP8PutBit(bw,(uint)(uVar10 != 2),(uint)(*pauVar11)[4]);
              lVar8 = 2;
              if (iVar6 != 0) {
                VP8PutBit(bw,(uint)(uVar10 == 4),(uint)(*pauVar11)[5]);
              }
            }
            else {
              iVar6 = VP8PutBit(bw,(uint)(10 < uVar7),(uint)(*pauVar11)[6]);
              if (iVar6 == 0) {
                iVar6 = VP8PutBit(bw,(uint)(6 < uVar7),(uint)(*pauVar11)[7]);
                if (iVar6 == 0) {
                  uVar10 = (uint)(uVar10 == 6);
                  iVar6 = 0x9f;
                }
                else {
                  VP8PutBit(bw,(uint)(8 < uVar7),0xa5);
                  uVar10 = ~uVar10 & 1;
                  iVar6 = 0x91;
                }
                VP8PutBit(bw,uVar10,iVar6);
                lVar8 = 2;
              }
              else {
                if (uVar7 < 0x13) {
                  VP8PutBit(bw,0,(uint)(*pauVar11)[8]);
                  VP8PutBit(bw,0,(uint)(*pauVar11)[9]);
                  uVar10 = 4;
                  iVar6 = -0xb;
                  puVar12 = VP8Cat3;
                }
                else if (uVar7 < 0x23) {
                  VP8PutBit(bw,0,(uint)(*pauVar11)[8]);
                  VP8PutBit(bw,1,(uint)(*pauVar11)[9]);
                  uVar10 = 8;
                  iVar6 = -0x13;
                  puVar12 = VP8Cat4;
                }
                else {
                  VP8PutBit(bw,1,(uint)(*pauVar11)[8]);
                  if (uVar7 < 0x43) {
                    VP8PutBit(bw,0,(uint)(*pauVar11)[10]);
                    uVar10 = 0x10;
                    iVar6 = -0x23;
                    puVar12 = VP8Cat5;
                  }
                  else {
                    VP8PutBit(bw,1,(uint)(*pauVar11)[10]);
                    uVar10 = 0x400;
                    iVar6 = -0x43;
                    puVar12 = VP8Cat6;
                  }
                }
                do {
                  bVar2 = *puVar12;
                  puVar12 = puVar12 + 1;
                  VP8PutBit(bw,(uint)((uVar10 & iVar6 + (uint)uVar7) != 0),(uint)bVar2);
                  bVar13 = 1 < uVar10;
                  uVar10 = uVar10 >> 1;
                } while (bVar13);
                lVar8 = 2;
              }
            }
          }
          pauVar11 = (uint8_t (*) [11])
                     ((long)*res->prob +
                     lVar8 * 0xb + (ulong)""[lVar9 + 1] * 0x20 + (ulong)""[lVar9 + 1]);
          VP8PutBitUniform(bw,(uint)(uVar3 >> 0xf));
          bVar13 = true;
          if (lVar1 != 0x10) {
            iVar6 = VP8PutBit(bw,(uint)(lVar9 < res->last),(uint)(*pauVar11)[0]);
            bVar13 = iVar6 == 0;
          }
        }
        iVar5 = 1;
      } while ((!bVar13) && (lVar9 = lVar1, lVar1 != 0x10));
    }
  }
  return iVar5;
}

Assistant:

static int PutCoeffs(VP8BitWriter* const bw, int ctx, const VP8Residual* res) {
  int n = res->first;
  // should be prob[VP8EncBands[n]], but it's equivalent for n=0 or 1
  const uint8_t* p = res->prob[n][ctx];
  if (!VP8PutBit(bw, res->last >= 0, p[0])) {
    return 0;
  }

  while (n < 16) {
    const int c = res->coeffs[n++];
    const int sign = c < 0;
    int v = sign ? -c : c;
    if (!VP8PutBit(bw, v != 0, p[1])) {
      p = res->prob[VP8EncBands[n]][0];
      continue;
    }
    if (!VP8PutBit(bw, v > 1, p[2])) {
      p = res->prob[VP8EncBands[n]][1];
    } else {
      if (!VP8PutBit(bw, v > 4, p[3])) {
        if (VP8PutBit(bw, v != 2, p[4])) {
          VP8PutBit(bw, v == 4, p[5]);
        }
      } else if (!VP8PutBit(bw, v > 10, p[6])) {
        if (!VP8PutBit(bw, v > 6, p[7])) {
          VP8PutBit(bw, v == 6, 159);
        } else {
          VP8PutBit(bw, v >= 9, 165);
          VP8PutBit(bw, !(v & 1), 145);
        }
      } else {
        int mask;
        const uint8_t* tab;
        if (v < 3 + (8 << 1)) {          // VP8Cat3  (3b)
          VP8PutBit(bw, 0, p[8]);
          VP8PutBit(bw, 0, p[9]);
          v -= 3 + (8 << 0);
          mask = 1 << 2;
          tab = VP8Cat3;
        } else if (v < 3 + (8 << 2)) {   // VP8Cat4  (4b)
          VP8PutBit(bw, 0, p[8]);
          VP8PutBit(bw, 1, p[9]);
          v -= 3 + (8 << 1);
          mask = 1 << 3;
          tab = VP8Cat4;
        } else if (v < 3 + (8 << 3)) {   // VP8Cat5  (5b)
          VP8PutBit(bw, 1, p[8]);
          VP8PutBit(bw, 0, p[10]);
          v -= 3 + (8 << 2);
          mask = 1 << 4;
          tab = VP8Cat5;
        } else {                         // VP8Cat6 (11b)
          VP8PutBit(bw, 1, p[8]);
          VP8PutBit(bw, 1, p[10]);
          v -= 3 + (8 << 3);
          mask = 1 << 10;
          tab = VP8Cat6;
        }
        while (mask) {
          VP8PutBit(bw, !!(v & mask), *tab++);
          mask >>= 1;
        }
      }
      p = res->prob[VP8EncBands[n]][2];
    }
    VP8PutBitUniform(bw, sign);
    if (n == 16 || !VP8PutBit(bw, n <= res->last, p[0])) {
      return 1;   // EOB
    }
  }
  return 1;
}